

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

void __thiscall re2::Compiler::AddRuneRange(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  if (this->encoding_ == kEncodingLatin1) {
    AddRuneRangeLatin1(this,lo,hi,foldcase);
    return;
  }
  AddRuneRangeUTF8(this,lo,hi,foldcase);
  return;
}

Assistant:

void Compiler::AddRuneRange(Rune lo, Rune hi, bool foldcase) {
  switch (encoding_) {
    default:
    case kEncodingUTF8:
      AddRuneRangeUTF8(lo, hi, foldcase);
      break;
    case kEncodingLatin1:
      AddRuneRangeLatin1(lo, hi, foldcase);
      break;
  }
}